

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

void ecs_notify_tables(ecs_world_t *world,ecs_table_event_t *event)

{
  ecs_sparse_t *sparse;
  int32_t iVar1;
  ecs_table_t *table_00;
  ecs_table_t *table;
  int32_t count;
  int32_t i;
  ecs_sparse_t *tables;
  ecs_table_event_t *event_local;
  ecs_world_t *world_local;
  
  sparse = (world->store).tables;
  iVar1 = ecs_sparse_count(sparse);
  for (table._4_4_ = 0; table._4_4_ < iVar1; table._4_4_ = table._4_4_ + 1) {
    table_00 = (ecs_table_t *)_ecs_sparse_get(sparse,0x80,table._4_4_);
    ecs_table_notify(world,table_00,event);
  }
  return;
}

Assistant:

void ecs_notify_tables(
    ecs_world_t *world,
    ecs_table_event_t *event)
{
    ecs_sparse_t *tables = world->store.tables;
    int32_t i, count = ecs_sparse_count(tables);

    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(tables, ecs_table_t, i);
        ecs_table_notify(world, table, event);
    }
}